

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_js_generator.cc
# Opt level: O2

string * __thiscall
t_js_generator::declare_field_abi_cxx11_
          (string *__return_storage_ptr__,t_js_generator *this,t_field *tfield,bool init,bool obj)

{
  uint uVar1;
  int iVar2;
  t_type *ptVar3;
  undefined4 extraout_var;
  undefined3 in_register_00000081;
  undefined1 auVar4 [12];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::operator+(__return_storage_ptr__,"this.",&tfield->name_);
  if (CONCAT31(in_register_00000081,obj) == 0) {
    std::operator+(&local_b0,&this->js_let_type_,&tfield->name_);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
  }
  if (init) {
    ptVar3 = t_type::get_true_type(tfield->type_);
    iVar2 = (*(ptVar3->super_t_doc)._vptr_t_doc[5])(ptVar3);
    if ((char)iVar2 == '\0') {
      iVar2 = (*(ptVar3->super_t_doc)._vptr_t_doc[10])(ptVar3);
      if ((((char)iVar2 == '\0') &&
          (iVar2 = (*(ptVar3->super_t_doc)._vptr_t_doc[0x10])(ptVar3), (char)iVar2 == '\0')) &&
         (iVar2 = (*(ptVar3->super_t_doc)._vptr_t_doc[0xd])(ptVar3), (char)iVar2 == '\0')) {
        iVar2 = (*(ptVar3->super_t_doc)._vptr_t_doc[0xb])(ptVar3);
        if (((char)iVar2 == '\0') &&
           (iVar2 = (*(ptVar3->super_t_doc)._vptr_t_doc[0xc])(ptVar3), (char)iVar2 == '\0')) {
          return __return_storage_ptr__;
        }
        if (obj) {
          js_type_namespace_abi_cxx11_(&local_70,this,ptVar3->program_);
          std::operator+(&local_50," = new ",&local_70);
          iVar2 = (*(ptVar3->super_t_doc)._vptr_t_doc[3])(ptVar3);
          std::operator+(&local_90,&local_50,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(extraout_var,iVar2));
          std::operator+(&local_b0,&local_90,"()");
          std::__cxx11::string::append((string *)__return_storage_ptr__);
          std::__cxx11::string::~string((string *)&local_b0);
          std::__cxx11::string::~string((string *)&local_90);
          std::__cxx11::string::~string((string *)&local_50);
          std::__cxx11::string::~string((string *)&local_70);
          return __return_storage_ptr__;
        }
      }
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    else {
      uVar1 = *(uint *)&ptVar3[1].super_t_doc._vptr_t_doc;
      if (uVar1 - 1 < 7) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      else if (uVar1 != 0) {
        auVar4 = __cxa_allocate_exception(0x10);
        t_base_type::t_base_name_abi_cxx11_(&local_90,(t_base_type *)(ulong)uVar1,auVar4._8_4_);
        std::operator+(&local_b0,"compiler error: no JS initializer for base type ",&local_90);
        std::runtime_error::runtime_error(auVar4._0_8_,(string *)&local_b0);
        __cxa_throw(auVar4._0_8_,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
  }
  else {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

string t_js_generator::declare_field(t_field* tfield, bool init, bool obj) {
  string result = "this." + tfield->get_name();

  if (!obj) {
    result = js_let_type_ + tfield->get_name();
  }

  if (init) {
    t_type* type = get_true_type(tfield->get_type());
    if (type->is_base_type()) {
      t_base_type::t_base tbase = ((t_base_type*)type)->get_base();
      switch (tbase) {
      case t_base_type::TYPE_VOID:
        break;
      case t_base_type::TYPE_STRING:
      case t_base_type::TYPE_BOOL:
      case t_base_type::TYPE_I8:
      case t_base_type::TYPE_I16:
      case t_base_type::TYPE_I32:
      case t_base_type::TYPE_I64:
      case t_base_type::TYPE_DOUBLE:
        result += " = null";
        break;
      default:
        throw std::runtime_error("compiler error: no JS initializer for base type " + t_base_type::t_base_name(tbase));
      }
    } else if (type->is_enum()) {
      result += " = null";
    } else if (type->is_map()) {
      result += " = null";
    } else if (type->is_container()) {
      result += " = null";
    } else if (type->is_struct() || type->is_xception()) {
      if (obj) {
        result += " = new " + js_type_namespace(type->get_program()) + type->get_name() + "()";
      } else {
        result += " = null";
      }
    }
  } else {
    result += " = null";
  }
  return result;
}